

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

long zng_inflateMark(zng_stream *strm)

{
  internal_state *piVar1;
  int iVar2;
  zng_stream *in_RDI;
  inflate_state *state;
  uint local_28;
  uint local_24;
  long local_8;
  
  iVar2 = inflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    piVar1 = in_RDI->state;
    if (*(int *)&piVar1->pending_buf == 0x3f43) {
      local_24 = piVar1->strstart;
    }
    else {
      if (*(int *)&piVar1->pending_buf == 0x3f4c) {
        local_28 = piVar1->pending - piVar1->strstart;
      }
      else {
        local_28 = 0;
      }
      local_24 = local_28;
    }
    local_8 = (long)piVar1->reproducible * 0x10000 + (ulong)local_24;
  }
  else {
    local_8 = -0x10000;
  }
  return local_8;
}

Assistant:

long Z_EXPORT PREFIX(inflateMark)(PREFIX3(stream) *strm) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return -65536;
    INFLATE_MARK_HOOK(strm);  /* hook for IBM Z DFLTCC */
    state = (struct inflate_state *)strm->state;
    return (long)(((unsigned long)((long)state->back)) << 16) +
        (state->mode == COPY ? state->length :
            (state->mode == MATCH ? state->was - state->length : 0));
}